

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::PopulateChildren
          (Node *this,TypeInfo *typeinfo)

{
  bool use_ints_for_enums;
  string *psVar1;
  pointer pcVar2;
  size_t size;
  pointer ppNVar3;
  bool bVar4;
  int iVar5;
  pointer ppNVar6;
  Node *field;
  iterator iVar7;
  LogMessage *pLVar8;
  undefined7 extraout_var;
  pointer ppNVar9;
  char cVar10;
  ulong uVar11;
  Node **__args;
  Type *pTVar12;
  Node *this_00;
  NodeKind NVar13;
  NodeKind kind;
  long lVar14;
  undefined1 local_158 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  orig_children_map;
  StatusOr<const_google::protobuf::Type_*> found_result;
  code *local_e0;
  undefined1 local_c0 [32];
  bool local_a0;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  Type *local_68;
  undefined1 auStack_58 [8];
  vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  new_children;
  LogFinisher local_32;
  bool local_31;
  
  if (this->type_ != (Type *)0x0) {
    iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_);
      if (iVar5 != 0) {
        iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_);
            if (iVar5 != 0) {
              auStack_58 = (undefined1  [8])0x0;
              new_children.
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              new_children.
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_158 = (undefined1  [8])&orig_children_map._M_h._M_rehash_policy._M_next_resize;
              orig_children_map._M_h._M_buckets = (__buckets_ptr)0x1;
              orig_children_map._M_h._M_bucket_count = 0;
              orig_children_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              orig_children_map._M_h._M_element_count._0_4_ = 0x3f800000;
              orig_children_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
              orig_children_map._M_h._M_rehash_policy._4_4_ = 0;
              orig_children_map._M_h._M_rehash_policy._M_next_resize = 0;
              local_c0._0_8_ = (ulong)(uint)local_c0._4_4_ << 0x20;
              ppNVar6 = (this->children_).
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((this->children_).
                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish != ppNVar6) {
                uVar11 = 0;
                do {
                  InsertIfNotPresent<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)local_158,&ppNVar6[uVar11]->name_,(second_type *)local_c0);
                  uVar11 = (long)(int)local_c0._0_4_ + 1;
                  local_c0._0_4_ = (int)uVar11;
                  ppNVar6 = (this->children_).
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (uVar11 < (ulong)((long)(this->children_).
                                                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppNVar6 >> 3));
              }
              pTVar12 = this->type_;
              if (0 < (pTVar12->fields_).super_RepeatedPtrFieldBase.current_size_) {
                path.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)&this->field_scrub_callback_;
                iVar5 = 0;
                do {
                  field = (Node *)protobuf::internal::RepeatedPtrFieldBase::
                                  Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                                            (&(pTVar12->fields_).super_RepeatedPtrFieldBase,iVar5);
                  auStack_88 = (undefined1  [8])0x0;
                  path.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  path.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  if ((this->path_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (this->path_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               auStack_88,0);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_88,((ArenaStringPtr *)&field->type_)->ptr_);
                  if ((this->field_scrub_callback_).super__Function_base._M_manager ==
                      (_Manager_type)0x0) {
LAB_00314995:
                    iVar7 = std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                    *)local_158,((ArenaStringPtr *)&field->type_)->ptr_);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                        ._M_cur == (__node_type *)0x0) {
                      if ((field->data_).field_2.i32_ == 0xb) {
                        psVar1 = ((ArenaStringPtr *)&field->kind_)->ptr_;
                        pcVar2 = (psVar1->_M_dataplus)._M_p;
                        size = psVar1->_M_string_length;
                        if ((long)size < 0) {
                          StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
                        }
                        (*typeinfo->_vptr_TypeInfo[2])
                                  (&orig_children_map._M_h._M_single_bucket,typeinfo,pcVar2,size);
                        local_68 = (Type *)found_result.status_.error_message_.field_2._8_8_;
                        if ((int)orig_children_map._M_h._M_single_bucket == 0) {
                          this_00 = field;
                          bVar4 = IsMap((Field *)field,
                                        (Type *)found_result.status_.error_message_.field_2._8_8_);
                          new_children.
                          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)CONCAT71(extraout_var,bVar4);
                          NVar13 = OBJECT;
                          if (bVar4) {
                            local_68 = GetMapValueType(this_00,local_68,typeinfo);
                            NVar13 = MAP;
                          }
                        }
                        else {
                          protobuf::internal::LogMessage::LogMessage
                                    ((LogMessage *)local_c0,LOGLEVEL_WARNING,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                                     ,0x163);
                          pLVar8 = protobuf::internal::LogMessage::operator<<
                                             ((LogMessage *)local_c0,"Cannot resolve type \'");
                          pLVar8 = protobuf::internal::LogMessage::operator<<
                                             (pLVar8,((ArenaStringPtr *)&field->kind_)->ptr_);
                          pLVar8 = protobuf::internal::LogMessage::operator<<(pLVar8,"\'.");
                          protobuf::internal::LogFinisher::operator=(&local_32,pLVar8);
                          protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c0);
                          NVar13 = OBJECT;
                          local_68 = (Type *)0x0;
                          new_children.
                          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        }
                        if ((size_type *)found_result.status_._0_8_ !=
                            &found_result.status_.error_message_._M_string_length) {
                          operator_delete((void *)found_result.status_._0_8_);
                        }
                        cVar10 = (char)new_children.
                                       super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      }
                      else {
                        local_68 = (Type *)0x0;
                        cVar10 = '\0';
                        NVar13 = PRIMITIVE;
                      }
                      kind = NVar13;
                      if (*(int *)((long)&(field->data_).field_2 + 4) == 3) {
                        kind = LIST;
                      }
                      if (cVar10 != '\0') {
                        kind = NVar13;
                      }
                      if ((*(int32 *)((long)&(field->data_).field_2 + 0xc) == 0) ||
                         (kind != PRIMITIVE)) {
                        new_children.
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)operator_new(0xc0);
                        psVar1 = *(string **)
                                  ((long)&((ArenaStringPtr *)&field->type_)->ptr_ +
                                  (ulong)((this->preserve_proto_field_names_ ^ 1) << 4));
                        if (kind == PRIMITIVE) {
                          CreateDefaultDataPieceForField
                                    ((DataPiece *)local_c0,(Field *)field,typeinfo,
                                     this->use_ints_for_enums_);
                        }
                        else {
                          local_c0._0_8_ = &PTR__DataPiece_003c8cd8;
                          local_c0._8_4_ = TYPE_NULL;
                          local_c0._16_4_ = 0;
                          local_a0 = false;
                        }
                        local_31 = this->suppress_empty_list_;
                        bVar4 = this->preserve_proto_field_names_;
                        use_ints_for_enums = this->use_ints_for_enums_;
                        std::
                        function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                        ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                                    *)&found_result.value_,
                                   (function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                                    *)path.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        ppNVar6 = new_children.
                                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        Node((Node *)new_children.
                                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar1,
                             local_68,kind,(DataPiece *)local_c0,true,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_88,local_31,bVar4,use_ints_for_enums,
                             (FieldScrubCallBack *)&found_result.value_);
                        if (local_e0 != (code *)0x0) {
                          (*local_e0)((_Any_data *)&found_result.value_,
                                      (_Any_data *)&found_result.value_,__destroy_functor);
                        }
                        local_c0._0_8_ = ppNVar6;
                        if (new_children.
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            new_children.
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::
                          vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                          ::
                          _M_realloc_insert<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>
                                    ((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                                      *)auStack_58,
                                     (iterator)
                                     new_children.
                                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(Node **)local_c0);
                        }
                        else {
                          *new_children.
                           super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start = (Node *)ppNVar6;
                          new_children.
                          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               new_children.
                               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1;
                        }
                      }
                    }
                    else {
                      __args = (this->children_).
                               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                               *(int *)((long)iVar7.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                              ._M_cur + 0x28);
                      if (new_children.
                          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                          new_children.
                          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        std::
                        vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                        ::
                        _M_realloc_insert<google::protobuf::util::converter::DefaultValueObjectWriter::Node*const&>
                                  ((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                                    *)auStack_58,
                                   (iterator)
                                   new_children.
                                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,__args);
                      }
                      else {
                        *new_children.
                         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start = *__args;
                        new_children.
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             new_children.
                             super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1;
                      }
                      (this->children_).
                      super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)iVar7.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                      ._M_cur + 0x28)] = (Node *)0x0;
                    }
                  }
                  else {
                    local_c0._0_8_ = field;
                    bVar4 = (*(this->field_scrub_callback_)._M_invoker)
                                      ((_Any_data *)
                                       path.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)auStack_88,(Field **)local_c0);
                    if (!bVar4) goto LAB_00314995;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_88);
                  iVar5 = iVar5 + 1;
                  pTVar12 = this->type_;
                } while (iVar5 < (pTVar12->fields_).super_RepeatedPtrFieldBase.current_size_);
              }
              ppNVar6 = (this->children_).
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppNVar9 = (this->children_).
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (ppNVar9 != ppNVar6) {
                lVar14 = 0;
                uVar11 = 0;
                do {
                  if (*(long *)((long)ppNVar6 + lVar14) != 0) {
                    std::
                    vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                    ::insert((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                              *)auStack_58,(const_iterator)auStack_58,
                             (value_type *)((long)ppNVar6 + lVar14));
                    *(undefined8 *)
                     ((long)(this->children_).
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar14) = 0;
                  }
                  uVar11 = uVar11 + 1;
                  ppNVar6 = (this->children_).
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ppNVar9 = (this->children_).
                            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  lVar14 = lVar14 + 8;
                } while (uVar11 < (ulong)((long)ppNVar9 - (long)ppNVar6 >> 3));
              }
              ppNVar3 = (this->children_).
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
              (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   new_children.
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   new_children.
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              auStack_58 = (undefined1  [8])ppNVar6;
              new_children.
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start = ppNVar9;
              new_children.
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_158);
              if (auStack_58 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_58);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DefaultValueObjectWriter::Node::PopulateChildren(
    const TypeInfo* typeinfo) {
  // Ignores well known types that don't require automatically populating their
  // primitive children. For type "Any", we only populate its children when the
  // "@type" field is set.
  // TODO(tsun): remove "kStructValueType" from the list. It's being checked
  //     now because of a bug in the tool-chain that causes the "oneof_index"
  //     of kStructValueType to not be set correctly.
  if (type_ == nullptr || type_->name() == kAnyType ||
      type_->name() == kStructType || type_->name() == kTimestampType ||
      type_->name() == kDurationType || type_->name() == kStructValueType) {
    return;
  }
  std::vector<Node*> new_children;
  std::unordered_map<std::string, int> orig_children_map;

  // Creates a map of child nodes to speed up lookup.
  for (int i = 0; i < children_.size(); ++i) {
    InsertIfNotPresent(&orig_children_map, children_[i]->name_, i);
  }

  for (int i = 0; i < type_->fields_size(); ++i) {
    const google::protobuf::Field& field = type_->fields(i);

    // This code is checking if the field to be added to the tree should be
    // scrubbed or not by calling the field_scrub_callback_ callback function.
    std::vector<std::string> path;
    if (!path_.empty()) {
      path.insert(path.begin(), path_.begin(), path_.end());
    }
    path.push_back(field.name());
    if (field_scrub_callback_ && field_scrub_callback_(path, &field)) {
      continue;
    }

    std::unordered_map<std::string, int>::iterator found =
        orig_children_map.find(field.name());
    // If the child field has already been set, we just add it to the new list
    // of children.
    if (found != orig_children_map.end()) {
      new_children.push_back(children_[found->second]);
      children_[found->second] = nullptr;
      continue;
    }

    const google::protobuf::Type* field_type = nullptr;
    bool is_map = false;
    NodeKind kind = PRIMITIVE;

    if (field.kind() == google::protobuf::Field::TYPE_MESSAGE) {
      kind = OBJECT;
      util::StatusOr<const google::protobuf::Type*> found_result =
          typeinfo->ResolveTypeUrl(field.type_url());
      if (!found_result.ok()) {
        // "field" is of an unknown type.
        GOOGLE_LOG(WARNING) << "Cannot resolve type '" << field.type_url() << "'.";
      } else {
        const google::protobuf::Type* found_type = found_result.value();
        is_map = IsMap(field, *found_type);

        if (!is_map) {
          field_type = found_type;
        } else {
          // If this field is a map, we should use the type of its "Value" as
          // the type of the child node.
          field_type = GetMapValueType(*found_type, typeinfo);
          kind = MAP;
        }
      }
    }

    if (!is_map &&
        field.cardinality() == google::protobuf::Field::CARDINALITY_REPEATED) {
      kind = LIST;
    }

    // If oneof_index() != 0, the child field is part of a "oneof", which means
    // the child field is optional and we shouldn't populate its default
    // primitive value.
    if (field.oneof_index() != 0 && kind == PRIMITIVE) continue;

    // If the child field is of primitive type, sets its data to the default
    // value of its type.
    std::unique_ptr<Node> child(
        new Node(preserve_proto_field_names_ ? field.name() : field.json_name(),
                 field_type, kind,
                 kind == PRIMITIVE ? CreateDefaultDataPieceForField(
                                         field, typeinfo, use_ints_for_enums_)
                                   : DataPiece::NullData(),
                 true, path, suppress_empty_list_, preserve_proto_field_names_,
                 use_ints_for_enums_, field_scrub_callback_));
    new_children.push_back(child.release());
  }
  // Adds all leftover nodes in children_ to the beginning of new_child.
  for (int i = 0; i < children_.size(); ++i) {
    if (children_[i] == nullptr) {
      continue;
    }
    new_children.insert(new_children.begin(), children_[i]);
    children_[i] = nullptr;
  }
  children_.swap(new_children);
}